

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O1

void dmrC_insert_branch(dmr_C *C,basic_block *bb,instruction *jmp,basic_block *target)

{
  int *piVar1;
  instruction *insn;
  undefined4 *ptr;
  basic_block *pbVar2;
  undefined1 local_50 [8];
  ptr_list_iter childiter__;
  
  insn = (instruction *)ptrlist_undo_last((ptr_list **)&bb->insns);
  if (insn == jmp) {
    dmrC_kill_insn(C,insn,0);
    ptr = (undefined4 *)dmrC_allocator_allocate(&C->L->instruction_allocator,0);
    *ptr = 3;
    *(position *)(ptr + 4) = C->L->current_pos;
    *(basic_block **)(ptr + 2) = bb;
    *(basic_block **)(ptr + 10) = target;
    ptrlist_add((ptr_list **)&bb->insns,ptr,&C->ptrlist_allocator);
    childiter__._16_8_ = &bb->children;
    ptrlist_forward_iterator((ptr_list_iter *)local_50,(ptr_list *)bb->children);
    pbVar2 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_50);
    if (pbVar2 != (basic_block *)0x0) {
      do {
        if (pbVar2 == target) {
          target = (basic_block *)0x0;
        }
        else {
          ptrlist_iter_remove((ptr_list_iter *)local_50);
          ptrlist_remove((ptr_list **)&pbVar2->parents,bb,1);
          if (pbVar2->parents == (basic_block_list *)0x0) {
            piVar1 = &C->L->repeat_phase;
            *piVar1 = *piVar1 | 3;
          }
        }
        pbVar2 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_50);
      } while (pbVar2 != (basic_block *)0x0);
    }
    ptrlist_pack((ptr_list **)childiter__._16_8_);
    return;
  }
  __assert_fail("old == jmp",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/linearize.c"
                ,0x2bf,
                "void dmrC_insert_branch(struct dmr_C *, struct basic_block *, struct instruction *, struct basic_block *)"
               );
}

Assistant:

void dmrC_insert_branch(struct dmr_C *C, struct basic_block *bb, struct instruction *jmp, struct basic_block *target)
{
	struct instruction *br, *old;
	struct basic_block *child;

	/* Remove the switch */
	old = dmrC_delete_last_instruction(&bb->insns);
	assert(old == jmp);
	dmrC_kill_instruction(C, old);

	br = alloc_instruction(C, OP_BR, 0);
	br->bb = bb;
	br->bb_true = target;
	dmrC_add_instruction(C, &bb->insns, br);

	FOR_EACH_PTR(bb->children, child) {
		if (child == target) {
			target = NULL;	/* Trigger just once */
			continue;
		}
		DELETE_CURRENT_PTR(child);
		remove_parent(C, child, bb);
	} END_FOR_EACH_PTR(child);
	ptrlist_pack((struct ptr_list **)&bb->children);
}